

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_asub_u_h_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  short sVar6;
  short sVar7;
  
  lVar3 = (ulong)ws * 0x10;
  lVar4 = (ulong)wt * 0x10;
  uVar1 = *(ushort *)((env->active_fpu).fpr + ws);
  uVar2 = *(ushort *)((env->active_fpu).fpr + wt);
  sVar6 = uVar1 - uVar2;
  sVar7 = -sVar6;
  if (uVar2 <= uVar1) {
    sVar7 = sVar6;
  }
  lVar5 = (ulong)wd * 0x10;
  *(short *)((env->active_fpu).fpr + wd) = sVar7;
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + lVar3 + 2);
  uVar2 = *(ushort *)((long)(env->active_fpu).fpr + lVar4 + 2);
  sVar6 = uVar1 - uVar2;
  sVar7 = -sVar6;
  if (uVar2 <= uVar1) {
    sVar7 = sVar6;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar5 + 2) = sVar7;
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + lVar3 + 4);
  uVar2 = *(ushort *)((long)(env->active_fpu).fpr + lVar4 + 4);
  sVar6 = uVar1 - uVar2;
  sVar7 = -sVar6;
  if (uVar2 <= uVar1) {
    sVar7 = sVar6;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar5 + 4) = sVar7;
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + lVar3 + 6);
  uVar2 = *(ushort *)((long)(env->active_fpu).fpr + lVar4 + 6);
  sVar6 = uVar1 - uVar2;
  sVar7 = -sVar6;
  if (uVar2 <= uVar1) {
    sVar7 = sVar6;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar5 + 6) = sVar7;
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + lVar3 + 8);
  uVar2 = *(ushort *)((long)(env->active_fpu).fpr + lVar4 + 8);
  sVar6 = uVar1 - uVar2;
  sVar7 = -sVar6;
  if (uVar2 <= uVar1) {
    sVar7 = sVar6;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar5 + 8) = sVar7;
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + lVar3 + 10);
  uVar2 = *(ushort *)((long)(env->active_fpu).fpr + lVar4 + 10);
  sVar6 = uVar1 - uVar2;
  sVar7 = -sVar6;
  if (uVar2 <= uVar1) {
    sVar7 = sVar6;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar5 + 10) = sVar7;
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + lVar3 + 0xc);
  uVar2 = *(ushort *)((long)(env->active_fpu).fpr + lVar4 + 0xc);
  sVar6 = uVar1 - uVar2;
  sVar7 = -sVar6;
  if (uVar2 <= uVar1) {
    sVar7 = sVar6;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar5 + 0xc) = sVar7;
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + lVar3 + 0xe);
  uVar2 = *(ushort *)((long)(env->active_fpu).fpr + lVar4 + 0xe);
  sVar6 = uVar1 - uVar2;
  sVar7 = -sVar6;
  if (uVar2 <= uVar1) {
    sVar7 = sVar6;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar5 + 0xe) = sVar7;
  return;
}

Assistant:

void helper_msa_asub_u_h(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_asub_u_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_asub_u_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_asub_u_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_asub_u_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_asub_u_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_asub_u_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_asub_u_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_asub_u_df(DF_HALF, pws->h[7],  pwt->h[7]);
}